

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O2

void cpptrace::detail::libdwarf::handle_dwarf_error(Dwarf_Debug dbg,Dwarf_Error error)

{
  internal_error *this;
  char *msg;
  Dwarf_Unsigned ev;
  
  ev = dwarf_errno(error);
  msg = dwarf_errmsg(error);
  this = (internal_error *)__cxa_allocate_exception(0x28);
  internal_error::internal_error<unsigned_long_long&,char*&>(this,"dwarf error {} {}",&ev,&msg);
  __cxa_throw(this,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

[[noreturn]] inline void handle_dwarf_error(Dwarf_Debug dbg, Dwarf_Error error) {
        Dwarf_Unsigned ev = dwarf_errno(error);
        char* msg = dwarf_errmsg(error);
        (void)dbg;
        // dwarf_dealloc_error(dbg, error);
        throw internal_error("dwarf error {} {}", ev, msg);
    }